

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Articulated_Parts_PDU::operator==
          (Articulated_Parts_PDU *this,Articulated_Parts_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  VariableParameter *pVVar3;
  pointer pKVar4;
  KBOOL KVar5;
  pointer pKVar6;
  VariableParameter **ppVVar7;
  
  KVar5 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if ((!KVar5) && (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams)) {
    pKVar1 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar6 = (Value->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vVariableParameters).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar6) {
      if (pKVar1 == pKVar2) {
        return pKVar1 == pKVar2;
      }
      if (pKVar1->m_pRef == pKVar6->m_pRef) {
        ppVVar7 = &pKVar6[1].m_pRef;
        do {
          pKVar6 = pKVar1 + 1;
          if (pKVar6 == pKVar2) {
            return pKVar6 == pKVar2;
          }
          pKVar4 = pKVar1 + 1;
          pVVar3 = *ppVVar7;
          ppVVar7 = ppVVar7 + 3;
          pKVar1 = pKVar6;
        } while (pKVar4->m_pRef == pVVar3);
        return false;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Articulated_Parts_PDU::operator == ( const Articulated_Parts_PDU & Value ) const
{
    if( LE_Header::operator      != ( Value ) )                     return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams )return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )   return false;
    return true;
}